

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O1

void ircode_free(ircode_t *code)

{
  inst_t **__ptr;
  _Bool **__ptr_00;
  uint32_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(uint)code->list->n;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      free(code->list->p[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  __ptr = code->list->p;
  if (__ptr != (inst_t **)0x0) {
    free(__ptr);
  }
  __ptr_00 = (code->context).p;
  if (__ptr_00 != (_Bool **)0x0) {
    free(__ptr_00);
  }
  puVar1 = (code->registers).p;
  if (puVar1 != (uint32_t *)0x0) {
    free(puVar1);
  }
  puVar1 = (code->label_true).p;
  if (puVar1 != (uint32_t *)0x0) {
    free(puVar1);
  }
  puVar1 = (code->label_false).p;
  if (puVar1 != (uint32_t *)0x0) {
    free(puVar1);
  }
  puVar1 = (code->label_check).p;
  if (puVar1 != (uint32_t *)0x0) {
    free(puVar1);
  }
  free(code->list);
  free(code);
  return;
}

Assistant:

void ircode_free (ircode_t *code) {
    uint32_t count = ircode_count(code);
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = marray_get(*code->list, i);
        mem_free(inst);
    }

    marray_destroy(*code->list);
    marray_destroy(code->context);
    marray_destroy(code->registers);
    marray_destroy(code->label_true);
    marray_destroy(code->label_false);
    marray_destroy(code->label_check);
    mem_free(code->list);
    mem_free(code);
}